

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::MultiplyPropagateStatistics::Operation<short,duckdb::TryMultiplyOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  int iVar1;
  long lVar2;
  int iVar3;
  short sVar4;
  int iVar5;
  ulong uVar6;
  short rvals [2];
  short lvals [2];
  short local_78 [4];
  Value local_70;
  
  local_78[2] = NumericStats::GetMin<short>(lstats);
  local_78[3] = NumericStats::GetMax<short>(lstats);
  local_78[0] = NumericStats::GetMin<short>(rstats);
  local_78[1] = NumericStats::GetMax<short>(rstats);
  iVar3 = 0x8000;
  iVar1 = 0x7fff;
  for (uVar6 = 0; uVar6 != 2; uVar6 = uVar6 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      iVar5 = (int)local_78[lVar2] * (int)local_78[uVar6 + 2];
      sVar4 = (short)iVar5;
      if (sVar4 != iVar5) goto LAB_0182233b;
      if (sVar4 <= (short)iVar1) {
        iVar1 = iVar5;
      }
      if ((short)iVar3 <= sVar4) {
        iVar3 = iVar5;
      }
    }
  }
  Value::Numeric(&local_70,type,(long)(short)iVar1);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)(short)iVar3);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
LAB_0182233b:
  return uVar6 < 2;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}